

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

void duckdb::ExpressionContainsGeneratedColumn
               (ParsedExpression *expr,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *gcols,bool *contains_gcol)

{
  ColumnRefExpression *this;
  string *__k;
  size_type sVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (*contains_gcol == false) {
    if ((expr->super_BaseExpression).type == COLUMN_REF) {
      this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
      __k = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
      sVar1 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&gcols->_M_h,__k);
      if (sVar1 != 0) {
        *contains_gcol = true;
        return;
      }
    }
    local_20 = ::std::
               _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:327:12)>
               ::_M_invoke;
    local_28 = ::std::
               _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:327:12)>
               ::_M_manager;
    local_38._M_unused._M_object = gcols;
    local_38._8_8_ = contains_gcol;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_38);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  }
  return;
}

Assistant:

void ExpressionContainsGeneratedColumn(const ParsedExpression &expr, const unordered_set<string> &gcols,
                                       bool &contains_gcol) {
	if (contains_gcol) {
		return;
	}
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &column_ref = expr.Cast<ColumnRefExpression>();
		auto &name = column_ref.GetColumnName();
		if (gcols.count(name)) {
			contains_gcol = true;
			return;
		}
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { ExpressionContainsGeneratedColumn(child, gcols, contains_gcol); });
}